

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v8::detail::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  char *__s;
  size_t sVar1;
  bool bVar2;
  type tVar3;
  decimal_fp<float> dVar4;
  int iVar5;
  size_t count;
  uint uVar6;
  fp value_00;
  decimal_fp<double> dVar7;
  int *in_stack_ffffffffffffff98;
  int exp;
  float local_48;
  float local_44;
  fp f;
  
  if (value < (longdouble)0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/fmt-src/include/fmt/format-inl.h"
                ,0x929,"value is negative");
  }
  if (value <= (longdouble)0) {
    if (precision < 1 || ((ulong)specs & 0xff00000000) != 0x200000000) {
      f.f = CONCAT71(f.f._1_7_,0x30);
      buffer<char>::push_back(buf,(char *)&f);
      exp = 0;
    }
    else {
      tVar3 = to_unsigned<int>(precision);
      buffer<char>::try_resize(buf,(ulong)tVar3);
      __s = buf->ptr_;
      tVar3 = to_unsigned<int>(precision);
      memset(__s,0x30,(ulong)tVar3);
      exp = -precision;
    }
  }
  else {
    uVar6 = specs._4_4_;
    if ((uVar6 >> 0x13 & 1) == 0) {
      if (precision < 0) {
        if ((uVar6 >> 0x12 & 1) == 0) {
          dVar7 = dragonbox::to_decimal<double>((double)value);
          write<char,_fmt::v8::appender,_unsigned_long,_0>((appender)buf,dVar7.significand);
          exp = dVar7.exponent;
        }
        else {
          local_48 = (float)value;
          dVar4 = dragonbox::to_decimal<float>(local_48);
          write<char,_fmt::v8::appender,_unsigned_int,_0>((appender)buf,dVar4.significand);
          exp = dVar4.exponent;
        }
      }
      else {
        exp = 0;
        f.f = 0;
        f.e = 0;
        if ((uVar6 >> 0x12 & 1) == 0) {
          bVar2 = fp::assign<long_double,_0>(&f,value);
        }
        else {
          local_44 = (float)value;
          value._0_8_ = in_stack_ffffffffffffff98;
          bVar2 = fp::assign<float,_0>(&f,local_44);
        }
        iVar5 = 0x2ff;
        if ((uint)precision < 0x2ff) {
          iVar5 = precision;
        }
        value_00.f = (ulong)(uint)f.e;
        value_00.e._0_1_ = bVar2;
        value_00._9_7_ = 0;
        format_dragon((detail *)f.f,value_00,SUB41(iVar5,0),(int)buf,(buffer<char> *)&exp,
                      value._0_8_);
        if ((uVar6 >> 0x14 & 1) == 0 && ((ulong)specs & 0xff00000000) != 0x200000000) {
          sVar1 = buf->size_;
          iVar5 = exp;
          do {
            exp = iVar5;
            count = sVar1;
            if (count == 0) break;
            sVar1 = count - 1;
            iVar5 = exp + 1;
          } while (buf->ptr_[count - 1] == '0');
          buffer<char>::try_resize(buf,count);
        }
      }
    }
    else {
      exp = snprintf_float<long_double>(value,precision,specs,buf);
    }
  }
  return exp;
}

Assistant:

FMT_HEADER_ONLY_CONSTEXPR20 int format_float(Float value, int precision,
                                             float_specs specs,
                                             buffer<char>& buf) {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (specs.fallback) return snprintf_float(value, precision, specs, buf);

  if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  int exp = 0;
  bool use_dragon = true;
  if (is_fast_float<Float>()) {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = fp();
    bool is_predecessor_closer =
        specs.binary32 ? f.assign(static_cast<float>(value)) : f.assign(value);
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, is_predecessor_closer, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}